

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O0

bool __thiscall delaunator::compare::operator()(compare *this,size_t i,size_t j)

{
  double dVar1;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  double diff3;
  double diff2;
  double diff1;
  double d2;
  double d1;
  size_t j_local;
  size_t i_local;
  compare *this_local;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i << 1);
  dVar4 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i * 2 + 1);
  dVar3 = dist(dVar4,*pvVar2,this->cx,this->cy);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,j << 1);
  dVar4 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,j * 2 + 1);
  dVar4 = dist(dVar4,*pvVar2,this->cx,this->cy);
  dVar3 = dVar3 - dVar4;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i << 1);
  dVar4 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,j << 1);
  dVar4 = dVar4 - *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,i * 2 + 1);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this->coords,j * 2 + 1);
  if ((0.0 < dVar3) || (dVar3 < 0.0)) {
    this_local._7_1_ = dVar3 < 0.0;
  }
  else if ((0.0 < dVar4) || (dVar4 < 0.0)) {
    this_local._7_1_ = dVar4 < 0.0;
  }
  else {
    this_local._7_1_ = dVar1 - *pvVar2 < 0.0;
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(std::size_t i, std::size_t j) {
        const double d1 = dist(coords[2 * i], coords[2 * i + 1], cx, cy);
        const double d2 = dist(coords[2 * j], coords[2 * j + 1], cx, cy);
        const double diff1 = d1 - d2;
        const double diff2 = coords[2 * i] - coords[2 * j];
        const double diff3 = coords[2 * i + 1] - coords[2 * j + 1];

        if (diff1 > 0.0 || diff1 < 0.0) {
            return diff1 < 0;
        } else if (diff2 > 0.0 || diff2 < 0.0) {
            return diff2 < 0;
        } else {
            return diff3 < 0;
        }
    }